

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void PAL_setbuf(PAL_FILE *f,char *buffer)

{
  if (PAL_InitializeChakraCoreCalled) {
    if (f == (PAL_FILE *)0x0) {
      fprintf(_stderr,"] %s %s:%d","PAL_setbuf",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/cruntime/file.cpp"
              ,0x273);
      fprintf(_stderr,"Expression: f != NULL\n");
    }
    setbuf((FILE *)f->bsdFilePtr,buffer);
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

void
_cdecl
PAL_setbuf(PAL_FILE * f, char * buffer)
{
    PERF_ENTRY(setbuf);
    ENTRY( "setbuf( %p, %p )\n", f, buffer );

    _ASSERTE(f != NULL);

    setbuf( f->bsdFilePtr, buffer );

    LOGEXIT( "setbuf\n" );
    PERF_EXIT(setbuf);
}